

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Jacobi
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZFMatrix<double> *pTVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  double dVar7;
  double local_f8;
  double local_f0;
  TPZFMatrix<double> *local_e8;
  TPZFMatrix<double> *local_e0;
  double local_d8;
  double dStack_d0;
  REAL local_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  long local_90;
  double local_88;
  double dStack_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if (0 < num) {
    local_f0 = JacobiA;
    local_b8 = JacobiB;
    uStack_b0 = 0;
    local_f8 = 1.0;
    local_e8 = phi;
    local_e0 = dphi;
    local_c0 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_f8);
    local_f8 = 0.0;
    (*(local_e0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x20])(local_e0,0,0,&local_f8);
    pTVar1 = local_e8;
    if (num != 1) {
      local_f8 = ((local_f0 + 2.0 + local_b8) * local_c0 + (local_f0 - local_b8)) * 0.5;
      (*(local_e8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x20])(local_e8,1,0,&local_f8);
      local_d8 = ((double)num + local_f0 + local_b8 + 1.0) * 0.5;
      pdVar2 = TPZFMatrix<double>::operator()(pTVar1,(ulong)(num - 1),0);
      local_f8 = local_d8 * *pdVar2;
      (*(local_e0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x20])(local_e0,0,1,&local_f8);
      pTVar1 = local_e8;
      local_78 = -(local_b8 * local_b8 - local_f0 * local_f0);
      uStack_70 = uStack_b0 ^ 0x8000000000000000;
      local_88 = local_b8;
      dStack_80 = local_b8;
      lVar3 = (ulong)(uint)num - 2;
      uVar5 = 6;
      lVar4 = 2;
      while (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
        local_98 = (double)(int)lVar4;
        local_90 = lVar4 + 1;
        local_48 = local_f0 + local_98;
        uStack_40 = 0;
        dVar7 = local_98 + local_98 + local_f0 + local_88;
        local_58 = dVar7 + 2.0;
        local_d8 = local_48 + dStack_80 + 1.0;
        dStack_a0 = (double)uVar5 * local_d8;
        local_68 = local_d8 * (double)(int)local_90 * dVar7;
        local_a8 = (((dVar7 + 1.0) * local_58) / dStack_a0) * local_c0 +
                   ((dVar7 + 1.0) * local_78) / (dStack_a0 * dVar7);
        local_98 = local_98 + local_b8;
        dStack_d0 = local_d8;
        dStack_60 = local_d8;
        dStack_50 = local_d8;
        pdVar2 = TPZFMatrix<double>::operator()(pTVar1,lVar4 + -1,0);
        local_a8 = local_a8 * *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(pTVar1,lVar4 + -2,0);
        local_f8 = local_a8 - ((local_98 * local_48 * local_58) / local_68) * *pdVar2;
        (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(pTVar1,lVar4,0,&local_f8);
        local_d8 = local_d8 * 0.5;
        pdVar2 = TPZFMatrix<double>::operator()(pTVar1,lVar4 + -1,0);
        local_f8 = local_d8 * *pdVar2;
        (*(local_e0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(local_e0,0,lVar4,&local_f8);
        uVar5 = uVar5 + 2;
        lVar4 = local_90;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Jacobi(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		// Quadratic or higher shape functions
        REAL a = JacobiA, b = JacobiB;
		if(num <= 0) return;
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, 0.5 * (a - b + (2.0 + a + b) * x));
		dphi.Put(0,1, 0.5*(num + a + b + 1)*phi(num-1,0) );
        // Following http://mathworld.wolfram.com/JacobiPolynomial.html
        REAL A_ab=0.0, B_ab=0.0, C_ab=0.0;
		for(int ord = 2;ord<num;ord++) {
            //Computing Coefficients for three terms recursion relation
            A_ab = ((2.0*ord+a+b+1)*(2.0*ord+a+b+2))/(2.0*(ord+1)*(ord+a+b+1));
            B_ab = ((b*b-a*a)*(2.0*ord+a+b+1))/(2.0*(ord+1)*(ord+a+b+1)*(2.0*ord+a+b));
            C_ab = ((ord+a)*(ord+b)*(2.0*ord+a+b+2))/((ord+1)*(ord+a+b+1)*(2.0*ord+a+b));
			phi.Put(ord,0, (A_ab*x - B_ab)*phi(ord-1,0) - C_ab*phi(ord-2,0));
			dphi.Put(0,ord, 0.5*(ord + a + b + 1)*phi(ord-1,0));
		}
	}